

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_clock_linux.c
# Opt level: O3

int os_clock_linux_gettime64(uint64_t *t64)

{
  int iVar1;
  long lVar2;
  time_t tVar3;
  timespec ts;
  timespec local_18;
  
  if (_clock_source == 0) {
    iVar1 = gettimeofday((timeval *)&local_18,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      lVar2 = os_clock_linux_gettime64::offset + local_18.tv_sec;
      tVar3 = os_clock_linux_gettime64::last_sec;
      if (os_clock_linux_gettime64::last_sec == 0) {
        tVar3 = lVar2;
      }
      os_clock_linux_gettime64::last_sec = lVar2;
      if (tVar3 + 0x3c < lVar2 || lVar2 < tVar3) {
        os_clock_linux_gettime64::offset = tVar3 - local_18.tv_sec;
        os_clock_linux_gettime64::last_sec = tVar3;
      }
      *t64 = (ulong)local_18.tv_nsec / 1000 + os_clock_linux_gettime64::last_sec * 1000;
      iVar1 = 0;
    }
  }
  else {
    iVar1 = clock_gettime(_clock_source,&local_18);
    if (iVar1 == 0) {
      *t64 = (ulong)local_18.tv_nsec / 1000000 + local_18.tv_sec * 1000;
    }
  }
  return iVar1;
}

Assistant:

int
os_clock_linux_gettime64(uint64_t *t64) {
  static time_t offset = 0, last_sec = 0;
  struct timeval tv;
  int error;

#if defined(CLOCK_MONOTONIC_RAW) || defined(CLOCK_MONOTONIC)
  if (_clock_source) {
    struct timespec ts;

    if ((error = clock_gettime(_clock_source, &ts)) != 0) {
      return error;
    }

    *t64 = 1000ull * ts.tv_sec + ts.tv_nsec / 1000000ull;
    return 0;
  }
#endif
  if ((error = gettimeofday(&tv, NULL)) != 0) {
    return error;
  }

  tv.tv_sec += offset;
  if (last_sec == 0) {
    last_sec = tv.tv_sec;
  }
  if (tv.tv_sec < last_sec || tv.tv_sec > last_sec + 60) {
    offset += last_sec - tv.tv_sec;
    tv.tv_sec = last_sec;
  }
  last_sec = tv.tv_sec;

  *t64 = 1000ull * tv.tv_sec + tv.tv_usec / 1000ull;
  return 0;
}